

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp++_test.cc
# Opt level: O2

void __thiscall
osqp::anon_unknown_0::OsqpTest_TwoDimLPWithEquality_Test::TestBody
          (OsqpTest_TwoDimLPWithEquality_Test *this)

{
  OsqpExitCode OVar1;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pCVar2;
  char *pcVar3;
  pointer *__ptr;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  char *message;
  char *in_R9;
  Span<const_double> expected;
  Span<const_double> expected_00;
  OsqpExitCode in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd7c;
  OsqpSolver solver;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  undefined8 in_stack_fffffffffffffda8;
  AssertHelper local_248;
  OsqpSettings local_240;
  Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_1a0;
  Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_188;
  SparseMatrix<double,_0,_int> constraint_matrix;
  OsqpInstance instance;
  Triplet<double,_int> kTripletsA [4];
  undefined1 local_28 [8];
  
  Eigen::SparseMatrix<double,_0,_int>::SparseMatrix(&constraint_matrix,3,2);
  instance.objective_matrix._0_8_ = kTripletsA;
  kTripletsA[0].m_row = 0;
  kTripletsA[0].m_col = 0;
  kTripletsA[0].m_value = 1.0;
  kTripletsA[1].m_row = 0;
  kTripletsA[1].m_col = 1;
  kTripletsA[1].m_value = 1.0;
  kTripletsA[2].m_row = 1;
  kTripletsA[2].m_col = 0;
  kTripletsA[2].m_value = 1.0;
  kTripletsA[3].m_row = 2;
  kTripletsA[3].m_col = 1;
  kTripletsA[3].m_value = 1.0;
  local_240.rho = (double)local_28;
  Eigen::SparseMatrix<double,0,int>::setFromTriplets<Eigen::Triplet<double,int>const*>
            ((SparseMatrix<double,0,int> *)&constraint_matrix,(Triplet<double,_int> **)&instance,
             (Triplet<double,_int> **)&local_240);
  OsqpInstance::OsqpInstance(&instance);
  Eigen::SparseMatrix<double,_0,_int>::SparseMatrix((SparseMatrix<double,_0,_int> *)&local_240,2,2);
  Eigen::SparseMatrix<double,0,long_long>::operator=
            ((SparseMatrix<double,0,long_long> *)&instance,
             (SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_> *)&local_240);
  Eigen::SparseMatrix<double,_0,_int>::~SparseMatrix((SparseMatrix<double,_0,_int> *)&local_240);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&instance.objective_vector.
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,2);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0xbff00000000000;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::CommaInitializer
            ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_240,
             &instance.objective_vector,(Scalar *)&gtest_ar);
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
            ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_240,
             (Scalar *)&gtest_ar_);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::finished
            ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_240);
  Eigen::SparseMatrix<double,0,long_long>::operator=
            ((SparseMatrix<double,0,long_long> *)&instance.constraint_matrix,
             (SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_> *)&constraint_matrix);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&instance.lower_bounds.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,3
            );
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0xfff00000000000;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::CommaInitializer
            ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_240,
             &instance.lower_bounds,(Scalar *)&gtest_ar);
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_240,
                      (Scalar *)&gtest_ar_);
  solver.workspace_._M_t.
  super___uniq_ptr_impl<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter>._M_t.
  super__Tuple_impl<0UL,_osqp::OSQPWorkspaceHelper_*,_osqp::OsqpSolver::OsqpDeleter>.
  super__Head_base<0UL,_osqp::OSQPWorkspaceHelper_*,_false>._M_head_impl =
       (unique_ptr<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter>)
       (__uniq_ptr_data<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter,_true,_true>)
       0x3fe0000000000000;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
            (pCVar2,(Scalar *)&solver);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::finished
            ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_240);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&instance.upper_bounds.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,3
            );
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0x3ff00000000000;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::CommaInitializer
            ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_240,
             &instance.upper_bounds,(Scalar *)&gtest_ar);
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_240,
                      (Scalar *)&(anonymous_namespace)::kInfinity);
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0x3fe00000000000;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
            (pCVar2,(Scalar *)&gtest_ar_);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::finished
            ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_240);
  solver.workspace_._M_t.
  super___uniq_ptr_impl<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter>._M_t.
  super__Tuple_impl<0UL,_osqp::OSQPWorkspaceHelper_*,_osqp::OsqpSolver::OsqpDeleter>.
  super__Head_base<0UL,_osqp::OSQPWorkspaceHelper_*,_false>._M_head_impl =
       (unique_ptr<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter>)
       (__uniq_ptr_data<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter,_true,_true>)0x0;
  OsqpSettings::OsqpSettings(&local_240);
  local_240.eps_abs = (double)&DAT_3ee4f8b588e368f1;
  local_240.eps_rel = 0.0;
  OsqpSolver::Init((OsqpSolver *)&gtest_ar,(OsqpInstance *)&solver,(OsqpSettings *)&instance);
  this_00 = &gtest_ar_.message_;
  gtest_ar_.success_ = gtest_ar._0_8_ == 1;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  absl::Status::~Status((Status *)&gtest_ar);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&stack0xfffffffffffffd78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,
               (AssertionResult *)"solver.Init(instance, settings).ok()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_248,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
               ,0xbf,(char *)gtest_ar._0_8_);
    testing::internal::AssertHelper::operator=(&local_248,(Message *)&stack0xfffffffffffffd78);
    testing::internal::AssertHelper::~AssertHelper(&local_248);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if ((long *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78) + 8))();
    }
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(this_00);
    OVar1 = OsqpSolver::Solve(&solver);
    gtest_ar_._0_4_ = OVar1;
    OVar1 = kOptimal;
    testing::internal::CmpHelperEQ<osqp::OsqpExitCode,osqp::OsqpExitCode>
              ((internal *)&gtest_ar,"solver.Solve()","OsqpExitCode::kOptimal",
               (OsqpExitCode *)&gtest_ar_,(OsqpExitCode *)&stack0xfffffffffffffd78);
    if (gtest_ar.success_ != false) {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      OsqpSolver::objective_value(&solver);
      pcVar3 = "kTolerance";
      testing::internal::DoubleNearPredFormat
                ((char *)solver.workspace_._M_t.
                         super___uniq_ptr_impl<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter>
                         ._M_t.
                         super__Tuple_impl<0UL,_osqp::OSQPWorkspaceHelper_*,_osqp::OsqpSolver::OsqpDeleter>
                         .super__Head_base<0UL,_osqp::OSQPWorkspaceHelper_*,_false>._M_head_impl,
                 (char *)CONCAT44(in_stack_fffffffffffffd7c,OVar1),(char *)gtest_ar_._0_8_,
                 (double)in_stack_fffffffffffffda8,
                 (double)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl,(double)gtest_ar._0_8_);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          message = "";
        }
        else {
          message = *(char **)gtest_ar.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl;
        }
        pcVar3 = (char *)0xc2;
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xfffffffffffffd78,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
                   ,0xc2,message);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xfffffffffffffd78,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffd78);
        if (gtest_ar_._0_8_ != 0) {
          (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      OsqpSolver::primal_solution(&local_188,&solver);
      gtest_ar.success_ = false;
      gtest_ar._1_7_ = 0x3fe00000000000;
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x3fe0000000000000;
      expected.len_ = (size_type)pcVar3;
      expected.ptr_ = (pointer)0x2;
      ExpectElementsAre((anon_unknown_0 *)&local_188,
                        (Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>
                         *)&gtest_ar,expected,1e-05);
      OsqpSolver::dual_solution(&local_1a0,&solver);
      gtest_ar.success_ = false;
      gtest_ar._1_7_ = 0x3ff00000000000;
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      expected_00.len_ = (size_type)pcVar3;
      expected_00.ptr_ = (pointer)0x3;
      ExpectElementsAre((anon_unknown_0 *)&local_1a0,
                        (Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>
                         *)&gtest_ar,expected_00,1e-05);
      goto LAB_00117146;
    }
    testing::Message::Message((Message *)&gtest_ar_);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffd78,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
               ,0xc0,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffd78,(Message *)&gtest_ar_);
    this_00 = &gtest_ar.message_;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffd78);
    if (gtest_ar_._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(this_00);
LAB_00117146:
  std::unique_ptr<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter>::~unique_ptr
            (&solver.workspace_);
  OsqpInstance::~OsqpInstance(&instance);
  Eigen::SparseMatrix<double,_0,_int>::~SparseMatrix(&constraint_matrix);
  return;
}

Assistant:

TEST(OsqpTest, TwoDimLPWithEquality) {
  // Minimize -x subject to:
  // x + y <= 1, x >= 0, y == 0.5.

  SparseMatrix<double> constraint_matrix(3, 2);
  const Triplet<double> kTripletsA[] = {
      {0, 0, 1.0}, {0, 1, 1.0}, {1, 0, 1.0}, {2, 1, 1.0}};
  constraint_matrix.setFromTriplets(std::begin(kTripletsA),
                                    std::end(kTripletsA));

  OsqpInstance instance;
  instance.objective_matrix = SparseMatrix<double>(2, 2);
  instance.objective_vector.resize(2);
  instance.objective_vector << -1.0, 0.0;
  instance.constraint_matrix = constraint_matrix;
  instance.lower_bounds.resize(3);
  instance.lower_bounds << -kInfinity, 0.0, 0.5;
  instance.upper_bounds.resize(3);
  instance.upper_bounds << 1.0, kInfinity, 0.5;

  OsqpSolver solver;
  OsqpSettings settings;
  settings.eps_abs = kTolerance;
  settings.eps_rel = 0.0;
  ASSERT_TRUE(solver.Init(instance, settings).ok());
  ASSERT_EQ(solver.Solve(), OsqpExitCode::kOptimal);

  EXPECT_NEAR(solver.objective_value(), -0.5, kTolerance);
  ExpectElementsAre(solver.primal_solution(), {0.5, 0.5}, kTolerance);
  ExpectElementsAre(solver.dual_solution(), {1.0, 0.0, -1.0}, kTolerance);
}